

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_serial_unix.cxx
# Opt level: O2

int ndiSerialRead(int serial_port,char *reply,int numberOfBytesToRead,bool isBinary,int *errorCode)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  uint uVar4;
  size_t __nbytes;
  
  __nbytes = (size_t)numberOfBytesToRead;
  uVar4 = 0;
  do {
    sVar2 = read(serial_port,reply + (int)uVar4,__nbytes);
    iVar1 = (int)sVar2;
    if (iVar1 == -1) {
      piVar3 = __errno_location();
      iVar1 = 0;
      if (*piVar3 != 0xb) {
        return -1;
      }
    }
    else if (iVar1 == 0) {
      return 0;
    }
    uVar4 = iVar1 + uVar4;
    if (isBinary) {
      iVar1 = strncmp(reply,"ERROR",5);
      if ((iVar1 == 0) && (reply[(long)(int)uVar4 + -1] == '\r')) {
        return uVar4;
      }
      if ((*reply == -0x3c) && (reply[1] == -0x5b)) {
        numberOfBytesToRead = (int)(ushort)(*(short *)(reply + 2) + 8);
      }
    }
    else if (reply[(long)(int)uVar4 + -1] == '\r') {
      return uVar4;
    }
    if (uVar4 == numberOfBytesToRead) {
      return uVar4;
    }
  } while( true );
}

Assistant:

ndicapiExport int ndiSerialRead(int serial_port, char* reply, int numberOfBytesToRead, bool isBinary, int* errorCode)
{
  int totalNumberOfBytesRead = 0;
  int totalNumberOfBytesToRead = numberOfBytesToRead;
  int numberOfBytesRead;
  bool binarySizeCalculated = false;

  do
  {
    if ((numberOfBytesRead = read(serial_port, &reply[totalNumberOfBytesRead], numberOfBytesToRead)) == -1)
    {
      if (errno == EAGAIN) /* canceled, so retry */
      {
        numberOfBytesRead = 0;
      }
      else
      {
        return -1; /* IO error occurred */
      }
    }
    else if (numberOfBytesRead == 0)   /* no characters read, must have timed out */
    {
      return 0;
    }

    totalNumberOfBytesRead += numberOfBytesRead;
    if ((!isBinary && reply[totalNumberOfBytesRead - 1] == '\r')      /* done when carriage return received (ASCII) or when ERROR... received (binary)*/
        || (isBinary && strncmp(reply, "ERROR", 5) == 0 && reply[totalNumberOfBytesRead - 1] == '\r'))
    {
      break;
    }

    if (isBinary && !binarySizeCalculated && reply[0] == (char)0xc4 && reply[1] == (char)0xa5)
    {
      // recalculate n based on the reply length (reported from ndi device) and the amount of data received so far
      unsigned short size = ((unsigned char)reply[2] | (unsigned char)reply[3] << 8) + 8; // 8 bytes -> 2 for Start Sequence (a5c4), 2 for reply length, 2 for header CRC, 2 for CRC16
      totalNumberOfBytesToRead = size;
    }
  }
  while (totalNumberOfBytesRead != totalNumberOfBytesToRead);

  return totalNumberOfBytesRead;
}